

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execDbcc<(moira::Core)2,(moira::Instr)49,(moira::Mode)12,2>(Moira *this,u16 opcode)

{
  anon_class_16_2_4c9db349 execLoop;
  anon_class_16_2_4c9db349 exec68010;
  anon_class_16_2_4c9db349 exec68000;
  u16 opcode_local;
  Moira *this_local;
  
  this->cp = 0;
  exec68000.this = (Moira *)((long)&exec68000.opcode + 6);
  exec68010.this = (Moira *)((long)&exec68000.opcode + 6);
  exec68010.opcode = (u16 *)this;
  exec68000.opcode._6_2_ = opcode;
  execDbcc<(moira::Core)2,_(moira::Instr)49,_(moira::Mode)12,_2>::anon_class_16_2_4c9db349::
  operator()((anon_class_16_2_4c9db349 *)&exec68010.opcode);
  return;
}

Assistant:

void
Moira::execDbcc(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    auto exec68000 = [&]() {

        SYNC(2);
        if (!cond<I>()) {

            int dn = _____________xxx(opcode);
            u32 newpc = U32_ADD(reg.pc, (i16)queue.irc);

            bool takeBranch = readD<Word>(dn) != 0;

            // Check for address error
            if (misaligned<C, S>(newpc)) {
                throw AddressError(makeFrame<AE_INC_PC>(newpc, newpc));
            }

            // Decrement loop counter
            writeD<Word>(dn, U32_SUB(readD<Word>(dn), 1));

            // Branch
            if (takeBranch) {
                reg.pc = newpc;
                fullPrefetch<C, POLL>();
                CYCLES_68000(10);
                CYCLES_68020(6);

            } else {

                (void)read<C, AddrSpace::PROG, Word>(reg.pc + 2);
                CYCLES_68000(14);
                CYCLES_68020(10);

                reg.pc += 2;
                fullPrefetch<C, POLL>();
            }

        } else {

            SYNC(2);
            CYCLES_68000(12);
            CYCLES_68020(6);

            // Fall through to next instruction
            reg.pc += 2;
            fullPrefetch<C, POLL>();
        }
    };

    auto exec68010 = [&]() {

        if (!cond<I>()) {

            SYNC(2);

            int dn = _____________xxx(opcode);
            i16 disp = (i16)queue.irc;

            u32 newpc = U32_ADD(reg.pc, disp);

            bool takeBranch = readD<Word>(dn) != 0;

            // Check for address error
            if (misaligned<C, S>(newpc)) {
                throw AddressError(makeFrame<AE_INC_PC>(newpc, newpc));
            }

            // Decrement loop counter
            writeD<Word>(dn, U32_SUB(readD<Word>(dn), 1));

            // Branch
            if (takeBranch) {

                reg.pc = newpc;
                fullPrefetch<C, POLL>();

                if (loop[queue.ird] && disp == -4) {

                    // Enter loop mode
                    flags |= State::LOOPING;
                    queue.irc = opcode;
                }

                if (MOIRA_MIMIC_MUSASHI) SYNC(2);
                CYCLES_68010(12);
                return;

            } else {

                (void)read<C, AddrSpace::PROG, Word>(reg.pc + 2);
                SYNC(MOIRA_MIMIC_MUSASHI ? 4 : 2);
                CYCLES_68010(8);

                reg.pc += 2;
                fullPrefetch<C, POLL>();
            }

        } else {

            SYNC(2);
            CYCLES_68010(2);

            reg.pc += 2;
            fullPrefetch<C, POLL>();
        }

        CYCLES_68010(10);
    };

    auto execLoop = [&]() {

        if (!cond<I>()) {

            int dn = _____________xxx(opcode);
            u32 newpc = U32_ADD(reg.pc, -4);

            bool takeBranch = readD<Word>(dn) != 0;

            // Check for address error
            if (misaligned<C, S>(newpc)) {
                throw AddressError(makeFrame<AE_INC_PC>(newpc, newpc));
            }

            // Decrement loop counter
            writeD<Word>(dn, U32_SUB(readD<Word>(dn), 1));

            // Branch
            if (takeBranch) {

                SYNC(6);
                reg.pc = newpc;
                reg.pc0 = reg.pc;
                queue.ird = queue.irc;
                queue.irc = opcode;
                POLL_IPL;
                return;

            } else {

                // Fall through to next instruction
                if (loopModeDelay) SYNC(loopModeDelay);
                loopModeDelay = 2;
                reg.pc += 2;
                fullPrefetch<C, POLL>();
                flags &= ~State::LOOPING;
            }

        } else {

            SYNC(4);
            // Fall through to next instruction
            reg.pc += 2;
            fullPrefetch<C, POLL>();
            flags &= ~State::LOOPING;
        }
    };

    switch (C) {

        case Core::C68000: exec68000(); break;
        case Core::C68010: looping<I>() ? execLoop() : exec68010(); break;
        case Core::C68020: exec68000(); break;

        default:
            fatalError;
    }

    FINALIZE
}